

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31sVertexAttributeBindingTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Stress::anon_unknown_0::BindVertexBufferCase::init
          (BindVertexBufferCase *this,EVP_PKEY_CTX *ctx)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 err;
  int extraout_EAX;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  reference pvVar5;
  ShaderProgram *this_00;
  ProgramSources *pPVar6;
  TestLog *log;
  TestError *this_01;
  allocator<char> local_1d9;
  string local_1d8;
  undefined1 local_1b2;
  allocator<char> local_1b1;
  string local_1b0;
  ShaderSource local_190;
  allocator<char> local_161;
  string local_160;
  ShaderSource local_140;
  ProgramSources local_118;
  allocator<tcu::Vector<float,_4>_> local_31;
  undefined1 local_30 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  Functions *gl;
  BindVertexBufferCase *this_local;
  
  pRVar4 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar3);
  iVar3 = this->m_drawCount;
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_31);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_30,
             (long)iVar3,&local_31);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_31);
  (**(code **)(data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage[0x6c].m_data + 2))
            (1,&this->m_buffer);
  (**(code **)data.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage[4].m_data)(0x8892,this->m_buffer);
  pcVar1 = *(code **)data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage[0x15].m_data;
  iVar3 = this->m_drawCount;
  pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_30,0);
  (*pcVar1)(0x8892,(long)(iVar3 << 4),pvVar5,0x88e4);
  err = (**(code **)data.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage[0x80].m_data)();
  glu::checkError(err,"buffer gen",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sVertexAttributeBindingTests.cpp"
                  ,0x227);
  this_00 = (ShaderProgram *)operator_new(0xd0);
  local_1b2 = 1;
  pRVar4 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,
             "#version 310 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,&local_161);
  glu::VertexSource::VertexSource((VertexSource *)&local_140,&local_160);
  pPVar6 = glu::ProgramSources::operator<<(&local_118,&local_140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,
             "#version 310 es\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(1.0, 1.0, 1.0, 1.0);\n}\n"
             ,&local_1b1);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_190,&local_1b0);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_190);
  glu::ShaderProgram::ShaderProgram(this_00,pRVar4,pPVar6);
  local_1b2 = 0;
  this->m_program = this_00;
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  glu::VertexSource::~VertexSource((VertexSource *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  glu::ProgramSources::~ProgramSources(&local_118);
  bVar2 = glu::ShaderProgram::isOk(this->m_program);
  if (!bVar2) {
    log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    glu::operator<<(log,this->m_program);
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"could not build program",&local_1d9);
    tcu::TestError::TestError(this_01,&local_1d8);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_30);
  return extraout_EAX;
}

Assistant:

void BindVertexBufferCase::init (void)
{
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	std::vector<tcu::Vec4>	data	(m_drawCount); // !< some junk data to make sure buffer is really allocated

	gl.genBuffers(1, &m_buffer);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_buffer);
	gl.bufferData(GL_ARRAY_BUFFER, int(m_drawCount * sizeof(tcu::Vec4)), &data[0], GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "buffer gen");

	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(s_vertexSource) << glu::FragmentSource(s_fragmentSource));
	if (!m_program->isOk())
	{
		m_testCtx.getLog() << *m_program;
		throw tcu::TestError("could not build program");
	}
}